

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O2

SiameseResult siamese_decoder_stats(SiameseDecoder decoder_t,uint64_t *statsOut,uint statsCount)

{
  uint uVar1;
  ulong uVar2;
  Decoder *decoder;
  ulong uVar3;
  
  if (statsCount == 0 || (statsOut == (uint64_t *)0x0 || decoder_t == (SiameseDecoder)0x0)) {
    return Siamese_InvalidInput;
  }
  uVar3 = 0xb;
  if (statsCount < 0xb) {
    uVar3 = (ulong)statsCount;
  }
  uVar1 = pktalloc::Allocator::GetMemoryAllocatedBytes((Allocator *)decoder_t);
  *(ulong *)(decoder_t + 0x218) = (ulong)uVar1;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    statsOut[uVar2] = *(uint64_t *)(decoder_t + uVar2 * 8 + 0x1c8);
  }
  return Siamese_Success;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decoder_stats(
    SiameseDecoder decoder_t,
    uint64_t* statsOut,
    unsigned statsCount)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder || !statsOut || statsCount <= 0)
        return Siamese_InvalidInput;

    return decoder->GetStatistics(
        statsOut,
        statsCount);
}